

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_sequence.cpp
# Opt level: O2

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateSequence(Transformer *this,PGCreateSeqStmt *stmt)

{
  allocator *__k;
  char cVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  undefined8 uVar4;
  int64_t iVar5;
  bool bVar6;
  bool bVar7;
  OnCreateConflict OVar8;
  pointer pCVar9;
  PGDefElem *pPVar10;
  PGValue *pPVar11;
  iterator iVar12;
  pointer pCVar13;
  ParserException *pPVar14;
  long in_RDX;
  undefined8 *puVar15;
  Transformer *this_00;
  undefined1 in_R8B;
  bool bVar16;
  bool bVar17;
  string_t input;
  int64_t iStack_1d0;
  allocator local_1c1;
  undefined1 local_1c0 [16];
  string local_1b0;
  int64_t opt_value;
  int64_t local_188;
  optional_ptr<duckdb_libpgquery::PGValue,_true> val;
  unordered_set<duckdb::SequenceInfo,_duckdb::EnumClassHash,_std::equal_to<duckdb::SequenceInfo>,_std::allocator<duckdb::SequenceInfo>_>
  used;
  string opt_name;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  anon_union_16_2_67f50693_for_value local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  QualifiedName qname;
  
  make_uniq<duckdb::CreateStatement>();
  make_uniq<duckdb::CreateSequenceInfo>();
  TransformQualifiedName(&qname,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar9->super_CreateInfo).catalog);
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar9->super_CreateInfo).schema);
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar9->name);
  if (*(long *)(in_RDX + 0x10) != 0) {
    local_1c0._8_8_ = this;
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    local_188 = pCVar9->start_value;
    used._M_h._M_buckets = &used._M_h._M_single_bucket;
    used._M_h._M_bucket_count = 1;
    used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    used._M_h._M_element_count = 0;
    used._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    used._M_h._M_rehash_policy._M_next_resize = 0;
    used._M_h._M_single_bucket = (__node_base_ptr)0x0;
    puVar15 = *(undefined8 **)(in_RDX + 0x10);
    bVar7 = false;
    __k = (allocator *)(local_1c0 + 0x10);
    while (this = (Transformer *)local_1c0._8_8_, puVar15 = (undefined8 *)puVar15[1],
          puVar15 != (undefined8 *)0x0) {
      def_elem.ptr = (PGDefElem *)*puVar15;
      pPVar10 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      ::std::__cxx11::string::string((string *)&opt_name,pPVar10->defname,__k);
      pPVar10 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      val.ptr = (PGValue *)pPVar10->arg;
      pPVar10 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->(&def_elem);
      bVar16 = pPVar10->defaction != PG_DEFELEM_UNSPEC;
      bVar17 = val.ptr != (PGValue *)0x0;
      opt_value = 0;
      if (val.ptr != (PGValue *)0x0) {
        pPVar11 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
        if (pPVar11->type == T_PGInteger) {
          pPVar11 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
          opt_value = (pPVar11->val).ival;
        }
        else {
          pPVar11 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
          if (pPVar11->type != T_PGFloat) {
            pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)(local_1c0 + 0x10),"Expected an integer argument for option %s",
                       &local_1c1);
            ::std::__cxx11::string::string((string *)&local_d0,(string *)&opt_name);
            ParserException::ParserException<std::__cxx11::string>
                      (pPVar14,(string *)(local_1c0 + 0x10),&local_d0);
            __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pPVar11 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&val);
          string_t::string_t((string_t *)&local_100.pointer,(pPVar11->val).str);
          input.value.pointer.ptr = (char *)&opt_value;
          input.value._0_8_ = local_100.pointer.ptr;
          bVar6 = TryCast::Operation<duckdb::string_t,long>
                            ((TryCast *)local_100._0_8_,input,(int64_t *)0x1,(bool)in_R8B);
          if (!bVar6) {
            pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)(local_1c0 + 0x10),"Expected an integer argument for option %s",
                       &local_1c1);
            ::std::__cxx11::string::string((string *)&local_b0,(string *)&opt_name);
            ParserException::ParserException<std::__cxx11::string>
                      (pPVar14,(string *)(local_1c0 + 0x10),&local_b0);
            __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      bVar6 = ::std::operator==(&opt_name,"increment");
      if (bVar6) {
        local_1b0._M_dataplus._M_p._0_1_ = 1;
        iVar12 = ::std::
                 _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&used._M_h,(key_type *)__k);
        if (iVar12.super__Node_iterator_base<duckdb::SequenceInfo,_true>._M_cur !=
            (__node_type *)0x0) {
          pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)(local_1c0 + 0x10),"Increment value should be passed as most once",
                     &local_1c1);
          ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
          __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_1b0._M_dataplus._M_p._0_1_ = 1;
        ::std::__detail::
        _Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)&used,(value_type *)__k);
        iVar5 = opt_value;
        if (bVar16 || bVar17) {
          pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                 *)local_1c0);
          pCVar9->increment = iVar5;
          pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                 *)local_1c0);
          if (pCVar9->increment == 0) {
            pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)(local_1c0 + 0x10),"Increment must not be zero",&local_1c1);
            ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
            __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                 *)local_1c0);
          if (pCVar9->increment < 0) {
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            pCVar9->max_value = -1;
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            pCVar9->min_value = -0x8000000000000000;
            iStack_1d0 = -1;
            local_188 = iStack_1d0;
          }
          else {
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            pCVar9->min_value = 1;
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            pCVar9->max_value = 0x7fffffffffffffff;
            iStack_1d0 = 1;
            local_188 = iStack_1d0;
          }
        }
      }
      else {
        bVar6 = ::std::operator==(&opt_name,"minvalue");
        if (bVar6) {
          local_1b0._M_dataplus._M_p._0_1_ = 2;
          iVar12 = ::std::
                   _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&used._M_h,(key_type *)__k);
          if (iVar12.super__Node_iterator_base<duckdb::SequenceInfo,_true>._M_cur !=
              (__node_type *)0x0) {
            pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)(local_1c0 + 0x10),"Minvalue should be passed as most once",
                       &local_1c1);
            ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
            __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_1b0._M_dataplus._M_p._0_1_ = 2;
          ::std::__detail::
          _Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&used,(value_type *)__k);
          iVar5 = opt_value;
          if (bVar16 || bVar17) {
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            pCVar9->min_value = iVar5;
            pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                   *)local_1c0);
            if (0 < pCVar9->increment) {
              pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                       ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                     *)local_1c0);
              local_188 = pCVar9->min_value;
            }
          }
        }
        else {
          bVar6 = ::std::operator==(&opt_name,"maxvalue");
          if (bVar6) {
            local_1b0._M_dataplus._M_p._0_1_ = 3;
            iVar12 = ::std::
                     _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&used._M_h,(key_type *)__k);
            if (iVar12.super__Node_iterator_base<duckdb::SequenceInfo,_true>._M_cur !=
                (__node_type *)0x0) {
              pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)(local_1c0 + 0x10),"Maxvalue should be passed as most once",
                         &local_1c1);
              ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
              __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_1b0._M_dataplus._M_p._0_1_ = 3;
            ::std::__detail::
            _Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::insert((_Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                      *)&used,(value_type *)__k);
            iVar5 = opt_value;
            if (bVar16 || bVar17) {
              pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                       ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                     *)local_1c0);
              pCVar9->max_value = iVar5;
              pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                       ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                     *)local_1c0);
              if (pCVar9->increment < 0) {
                pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                       *)local_1c0);
                local_188 = pCVar9->max_value;
              }
            }
          }
          else {
            bVar6 = ::std::operator==(&opt_name,"start");
            if (bVar6) {
              local_1b0._M_dataplus._M_p._0_1_ = 0;
              iVar12 = ::std::
                       _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find(&used._M_h,(key_type *)__k);
              if (iVar12.super__Node_iterator_base<duckdb::SequenceInfo,_true>._M_cur !=
                  (__node_type *)0x0) {
                pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)(local_1c0 + 0x10),"Start value should be passed as most once",
                           &local_1c1);
                ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
                __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1b0._M_dataplus._M_p._0_1_ = 0;
              ::std::__detail::
              _Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              ::insert((_Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                        *)&used,(value_type *)__k);
              iVar5 = opt_value;
              if (bVar16 || bVar17) {
                pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                       *)local_1c0);
                pCVar9->start_value = iVar5;
                bVar7 = true;
              }
            }
            else {
              bVar6 = ::std::operator==(&opt_name,"cycle");
              if (!bVar6) {
                pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)(local_1c0 + 0x10),
                           "Unrecognized option \"%s\" for CREATE SEQUENCE",&local_1c1);
                ::std::__cxx11::string::string((string *)&local_f0,(string *)&opt_name);
                ParserException::ParserException<std::__cxx11::string>
                          (pPVar14,(string *)(local_1c0 + 0x10),&local_f0);
                __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1b0._M_dataplus._M_p._0_1_ = 4;
              iVar12 = ::std::
                       _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find(&used._M_h,(key_type *)__k);
              if (iVar12.super__Node_iterator_base<duckdb::SequenceInfo,_true>._M_cur !=
                  (__node_type *)0x0) {
                pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)(local_1c0 + 0x10),"Cycle value should be passed as most once",
                           &local_1c1);
                ParserException::ParserException(pPVar14,(string *)(local_1c0 + 0x10));
                __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1b0._M_dataplus._M_p._0_1_ = 4;
              ::std::__detail::
              _Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              ::insert((_Insert<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                        *)&used,(value_type *)__k);
              iVar5 = opt_value;
              if (bVar16 || bVar17) {
                pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                       *)local_1c0);
                pCVar9->cycle = 0 < iVar5;
              }
            }
          }
        }
      }
      ::std::__cxx11::string::~string((string *)&opt_name);
    }
    if (!bVar7) {
      pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                             *)local_1c0);
      pCVar9->start_value = local_188;
    }
    ::std::
    _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&used._M_h);
  }
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  this_00 = (Transformer *)local_1c0;
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)this_00);
  (pCVar9->super_CreateInfo).temporary = cVar1 == '\0';
  OVar8 = TransformOnConflict(this_00,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  (pCVar9->super_CreateInfo).on_conflict = OVar8;
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  lVar2 = pCVar9->max_value;
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  if (lVar2 <= pCVar9->min_value) {
    pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&used,"MINVALUE (%lld) must be less than MAXVALUE (%lld)",
               (allocator *)&opt_name);
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    lVar2 = pCVar9->min_value;
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    ParserException::ParserException<long,long>(pPVar14,(string *)&used,lVar2,pCVar9->max_value);
    __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  lVar2 = pCVar9->start_value;
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  if (lVar2 < pCVar9->min_value) {
    pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&used,"START value (%lld) cannot be less than MINVALUE (%lld)",
               (allocator *)&opt_name);
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    lVar2 = pCVar9->start_value;
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    ParserException::ParserException<long,long>(pPVar14,(string *)&used,lVar2,pCVar9->min_value);
    __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  lVar2 = pCVar9->start_value;
  pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)local_1c0);
  uVar4 = local_1c0._0_8_;
  if (pCVar9->max_value < lVar2) {
    pPVar14 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&used,"START value (%lld) cannot be greater than MAXVALUE (%lld)",
               (allocator *)&opt_name);
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    lVar2 = pCVar9->start_value;
    pCVar9 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                           *)local_1c0);
    ParserException::ParserException<long,long>(pPVar14,(string *)&used,lVar2,pCVar9->max_value);
    __cxa_throw(pPVar14,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1c0._0_8_ =
       (__uniq_ptr_data<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true,_true>
        )0x0;
  pCVar13 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
            ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                          *)this);
  _Var3._M_head_impl =
       (pCVar13->info).
       super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar13->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)uVar4;
  if (_Var3._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
  }
  QualifiedName::~QualifiedName(&qname);
  if ((_Tuple_impl<0UL,_duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>
       )local_1c0._0_8_ != (CreateSequenceInfo *)0x0) {
    (**(code **)(*(long *)local_1c0._0_8_ + 8))();
  }
  return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         (__uniq_ptr_impl<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         this;
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateSequence(duckdb_libpgquery::PGCreateSeqStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateSequenceInfo>();

	auto qname = TransformQualifiedName(*stmt.sequence);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->name = qname.name;

	if (stmt.options) {
		int64_t default_start_value = info->start_value;
		bool has_start_value = false;
		unordered_set<SequenceInfo, EnumClassHash> used;
		duckdb_libpgquery::PGListCell *cell = nullptr;
		for_each_cell(cell, stmt.options->head) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
			string opt_name = string(def_elem->defname);
			auto val = PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg);
			bool nodef = def_elem->defaction == duckdb_libpgquery::PG_DEFELEM_UNSPEC && !val; // e.g. NO MINVALUE
			int64_t opt_value = 0;

			if (val) {
				if (val->type == duckdb_libpgquery::T_PGInteger) {
					opt_value = val->val.ival;
				} else if (val->type == duckdb_libpgquery::T_PGFloat) {
					if (!TryCast::Operation<string_t, int64_t>(string_t(val->val.str), opt_value, true)) {
						throw ParserException("Expected an integer argument for option %s", opt_name);
					}
				} else {
					throw ParserException("Expected an integer argument for option %s", opt_name);
				}
			}
			if (opt_name == "increment") {
				if (used.find(SequenceInfo::SEQ_INC) != used.end()) {
					throw ParserException("Increment value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_INC);
				if (nodef) {
					continue;
				}

				info->increment = opt_value;
				if (info->increment == 0) {
					throw ParserException("Increment must not be zero");
				}
				if (info->increment < 0) {
					default_start_value = info->max_value = -1;
					info->min_value = NumericLimits<int64_t>::Minimum();
				} else {
					default_start_value = info->min_value = 1;
					info->max_value = NumericLimits<int64_t>::Maximum();
				}
			} else if (opt_name == "minvalue") {
				if (used.find(SequenceInfo::SEQ_MIN) != used.end()) {
					throw ParserException("Minvalue should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_MIN);
				if (nodef) {
					continue;
				}

				info->min_value = opt_value;
				if (info->increment > 0) {
					default_start_value = info->min_value;
				}
			} else if (opt_name == "maxvalue") {
				if (used.find(SequenceInfo::SEQ_MAX) != used.end()) {
					throw ParserException("Maxvalue should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_MAX);
				if (nodef) {
					continue;
				}

				info->max_value = opt_value;
				if (info->increment < 0) {
					default_start_value = info->max_value;
				}
			} else if (opt_name == "start") {
				if (used.find(SequenceInfo::SEQ_START) != used.end()) {
					throw ParserException("Start value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_START);
				if (nodef) {
					continue;
				}
				has_start_value = true;
				info->start_value = opt_value;
			} else if (opt_name == "cycle") {
				if (used.find(SequenceInfo::SEQ_CYCLE) != used.end()) {
					throw ParserException("Cycle value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_CYCLE);
				if (nodef) {
					continue;
				}

				info->cycle = opt_value > 0;
			} else {
				throw ParserException("Unrecognized option \"%s\" for CREATE SEQUENCE", opt_name);
			}
		}
		if (!has_start_value) {
			info->start_value = default_start_value;
		}
	}
	info->temporary = !stmt.sequence->relpersistence;
	info->on_conflict = TransformOnConflict(stmt.onconflict);
	if (info->max_value <= info->min_value) {
		throw ParserException("MINVALUE (%lld) must be less than MAXVALUE (%lld)", info->min_value, info->max_value);
	}
	if (info->start_value < info->min_value) {
		throw ParserException("START value (%lld) cannot be less than MINVALUE (%lld)", info->start_value,
		                      info->min_value);
	}
	if (info->start_value > info->max_value) {
		throw ParserException("START value (%lld) cannot be greater than MAXVALUE (%lld)", info->start_value,
		                      info->max_value);
	}
	result->info = std::move(info);
	return result;
}